

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  bool bVar2;
  byte bVar3;
  stbi_uc sVar4;
  int iVar5;
  uint uVar6;
  uint local_ec;
  uchar local_e8 [4];
  uchar *puStack_e0;
  uchar temp_1;
  uchar *tga_pixel;
  int local_d0;
  int iStack_cc;
  uchar temp;
  int index2;
  int index1;
  int pal_idx;
  int RLE_cmd;
  stbi_uc *pal_entry;
  stbi_uc *tga_row;
  int row;
  int read_next_pixel;
  int RLE_repeating;
  int RLE_count;
  uchar raw_data [4];
  int j;
  int i;
  uchar *tga_palette;
  uchar *tga_data;
  int local_78;
  int tga_inverted;
  int tga_rgb16;
  int tga_comp;
  int tga_bits_per_pixel;
  int tga_height;
  int tga_width;
  int tga_y_origin;
  int tga_x_origin;
  int tga_palette_bits;
  int tga_palette_len;
  int tga_palette_start;
  int tga_is_RLE;
  int tga_image_type;
  int tga_indexed;
  int tga_offset;
  stbi__result_info *ri_local;
  int *piStack_30;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  _tga_indexed = ri;
  ri_local._4_4_ = req_comp;
  piStack_30 = comp;
  comp_local = y;
  y_local = x;
  x_local = (int *)s;
  bVar3 = stbi__get8(s);
  tga_image_type = (int)bVar3;
  bVar3 = stbi__get8((stbi__context *)x_local);
  tga_is_RLE = (int)bVar3;
  bVar3 = stbi__get8((stbi__context *)x_local);
  tga_palette_start = (int)bVar3;
  tga_palette_len = 0;
  tga_palette_bits = stbi__get16le((stbi__context *)x_local);
  tga_x_origin = stbi__get16le((stbi__context *)x_local);
  bVar3 = stbi__get8((stbi__context *)x_local);
  tga_y_origin = (int)bVar3;
  tga_width = stbi__get16le((stbi__context *)x_local);
  tga_height = stbi__get16le((stbi__context *)x_local);
  tga_bits_per_pixel = stbi__get16le((stbi__context *)x_local);
  tga_comp = stbi__get16le((stbi__context *)x_local);
  bVar3 = stbi__get8((stbi__context *)x_local);
  tga_rgb16 = (int)bVar3;
  local_78 = 0;
  bVar3 = stbi__get8((stbi__context *)x_local);
  _j = (stbi_uc *)0x0;
  memset(&RLE_repeating,0,4);
  read_next_pixel = 0;
  row = 0;
  bVar2 = true;
  if (7 < tga_palette_start) {
    tga_palette_start = tga_palette_start + -8;
    tga_palette_len = 1;
  }
  uVar6 = (int)(uint)bVar3 >> 5 & 1;
  if (tga_is_RLE == 0) {
    tga_inverted = stbi__tga_get_comp(tga_rgb16,(uint)(tga_palette_start == 3),&local_78);
  }
  else {
    tga_inverted = stbi__tga_get_comp(tga_y_origin,0,&local_78);
  }
  if (tga_inverted == 0) {
    stbi__err("bad format");
    s_local = (stbi__context *)0x0;
  }
  else {
    *y_local = tga_bits_per_pixel;
    *comp_local = tga_comp;
    if (piStack_30 != (int *)0x0) {
      *piStack_30 = tga_inverted;
    }
    iVar5 = stbi__mad3sizes_valid(tga_bits_per_pixel,tga_comp,tga_inverted,0);
    if (iVar5 == 0) {
      stbi__err("too large");
      s_local = (stbi__context *)0x0;
    }
    else {
      tga_palette = (uchar *)stbi__malloc_mad3(tga_bits_per_pixel,tga_comp,tga_inverted,0);
      if (tga_palette == (uchar *)0x0) {
        stbi__err("outofmem");
        s_local = (stbi__context *)0x0;
      }
      else {
        stbi__skip((stbi__context *)x_local,tga_image_type);
        if (((tga_is_RLE == 0) && (tga_palette_len == 0)) && (local_78 == 0)) {
          raw_data[0] = '\0';
          raw_data[1] = '\0';
          raw_data[2] = '\0';
          raw_data[3] = '\0';
          for (; (int)raw_data < tga_comp; raw_data = (uchar  [4])((int)raw_data + 1)) {
            if (uVar6 == 1) {
              local_e8[0] = raw_data[0];
              local_e8[1] = raw_data[1];
              local_e8[2] = raw_data[2];
              local_e8[3] = raw_data[3];
            }
            else {
              local_e8 = (uchar  [4])((tga_comp - (int)raw_data) + -1);
            }
            stbi__getn((stbi__context *)x_local,
                       tga_palette + (int)local_e8 * tga_bits_per_pixel * tga_inverted,
                       tga_bits_per_pixel * tga_inverted);
          }
        }
        else {
          if (tga_is_RLE != 0) {
            stbi__skip((stbi__context *)x_local,tga_palette_bits);
            _j = (stbi_uc *)stbi__malloc_mad2(tga_x_origin,tga_inverted,0);
            if (_j == (stbi_uc *)0x0) {
              free(tga_palette);
              stbi__err("outofmem");
              return (void *)0x0;
            }
            if (local_78 == 0) {
              iVar5 = stbi__getn((stbi__context *)x_local,_j,tga_x_origin * tga_inverted);
              if (iVar5 == 0) {
                free(tga_palette);
                free(_j);
                stbi__err("bad palette");
                return (void *)0x0;
              }
            }
            else {
              if (tga_inverted != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/stb_image.h"
                              ,0x15e0,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              raw_data[0] = '\0';
              raw_data[1] = '\0';
              raw_data[2] = '\0';
              raw_data[3] = '\0';
              _pal_idx = _j;
              for (; (int)raw_data < tga_x_origin; raw_data = (uchar  [4])((int)raw_data + 1)) {
                stbi__tga_read_rgb16((stbi__context *)x_local,_pal_idx);
                _pal_idx = _pal_idx + tga_inverted;
              }
            }
          }
          raw_data[0] = '\0';
          raw_data[1] = '\0';
          raw_data[2] = '\0';
          raw_data[3] = '\0';
          for (; (int)raw_data < tga_bits_per_pixel * tga_comp;
              raw_data = (uchar  [4])((int)raw_data + 1)) {
            if (tga_palette_len == 0) {
              bVar2 = true;
            }
            else if (read_next_pixel == 0) {
              bVar3 = stbi__get8((stbi__context *)x_local);
              read_next_pixel = (bVar3 & 0x7f) + 1;
              row = (int)(uint)bVar3 >> 7;
              bVar2 = true;
            }
            else if (row == 0) {
              bVar2 = true;
            }
            if (bVar2) {
              if (tga_is_RLE == 0) {
                if (local_78 == 0) {
                  for (RLE_count = 0; RLE_count < tga_inverted; RLE_count = RLE_count + 1) {
                    sVar4 = stbi__get8((stbi__context *)x_local);
                    *(stbi_uc *)((long)&RLE_repeating + (long)RLE_count) = sVar4;
                  }
                }
                else {
                  if (tga_inverted != 3) {
                    __assert_fail("tga_comp == STBI_rgb",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/stb_image.h"
                                  ,0x1611,
                                  "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                 );
                  }
                  stbi__tga_read_rgb16((stbi__context *)x_local,(stbi_uc *)&RLE_repeating);
                }
              }
              else {
                if (tga_rgb16 == 8) {
                  bVar3 = stbi__get8((stbi__context *)x_local);
                  local_ec = (uint)bVar3;
                }
                else {
                  local_ec = stbi__get16le((stbi__context *)x_local);
                }
                index2 = local_ec;
                if (tga_x_origin <= (int)local_ec) {
                  index2 = 0;
                }
                iVar5 = tga_inverted * index2;
                for (RLE_count = 0; RLE_count < tga_inverted; RLE_count = RLE_count + 1) {
                  *(stbi_uc *)((long)&RLE_repeating + (long)RLE_count) = _j[iVar5 + RLE_count];
                }
              }
              bVar2 = false;
            }
            for (RLE_count = 0; RLE_count < tga_inverted; RLE_count = RLE_count + 1) {
              tga_palette[(int)raw_data * tga_inverted + RLE_count] =
                   *(uchar *)((long)&RLE_repeating + (long)RLE_count);
            }
            read_next_pixel = read_next_pixel + -1;
          }
          if (uVar6 != 1) {
            for (RLE_count = 0; RLE_count * 2 < tga_comp; RLE_count = RLE_count + 1) {
              iStack_cc = RLE_count * tga_bits_per_pixel * tga_inverted;
              local_d0 = ((tga_comp + -1) - RLE_count) * tga_bits_per_pixel * tga_inverted;
              for (raw_data = (uchar  [4])(tga_bits_per_pixel * tga_inverted); 0 < (int)raw_data;
                  raw_data = (uchar  [4])((int)raw_data + -1)) {
                uVar1 = tga_palette[iStack_cc];
                tga_palette[iStack_cc] = tga_palette[local_d0];
                tga_palette[local_d0] = uVar1;
                iStack_cc = iStack_cc + 1;
                local_d0 = local_d0 + 1;
              }
            }
          }
          if (_j != (stbi_uc *)0x0) {
            free(_j);
          }
        }
        if ((2 < tga_inverted) && (local_78 == 0)) {
          raw_data[0] = '\0';
          raw_data[1] = '\0';
          raw_data[2] = '\0';
          raw_data[3] = '\0';
          puStack_e0 = tga_palette;
          for (; (int)raw_data < tga_bits_per_pixel * tga_comp;
              raw_data = (uchar  [4])((int)raw_data + 1)) {
            uVar1 = *puStack_e0;
            *puStack_e0 = puStack_e0[2];
            puStack_e0[2] = uVar1;
            puStack_e0 = puStack_e0 + tga_inverted;
          }
        }
        if ((ri_local._4_4_ != 0) && (ri_local._4_4_ != tga_inverted)) {
          tga_palette = stbi__convert_format
                                  (tga_palette,tga_inverted,ri_local._4_4_,tga_bits_per_pixel,
                                   tga_comp);
        }
        s_local = (stbi__context *)tga_palette;
      }
    }
  }
  return s_local;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}